

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O0

int vocgol(voccxdef *ctx,objnum *list,uint *flags,char **wrdlst,int *typlst,int first,int cur,
          int last,int ofword)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  ushort **ppuVar6;
  long in_RCX;
  long in_RDX;
  undefined2 *in_RSI;
  voccxdef *in_RDI;
  long in_R8;
  char *pcVar7;
  int in_R9D;
  bool bVar8;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int i;
  char buf [128];
  int wrdtyp;
  int trying_endadj;
  int try_endadj;
  int try_noun_before_num;
  int try_plural;
  vocseadef search_ctx;
  int len;
  int cnt;
  vocwdef *v;
  int typ;
  char *wrd;
  char *local_150;
  char *local_148;
  int local_12c;
  char local_128 [40];
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  char *in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff14;
  vocseadef *in_stack_ffffffffffffff18;
  voccxdef *in_stack_ffffffffffffff20;
  vocseadef *in_stack_ffffffffffffff30;
  int local_9c;
  uint local_8c;
  long local_88;
  int local_58;
  int local_54;
  vocwdef *local_50;
  byte *local_40;
  int local_4;
  
  local_40 = *(byte **)(in_RCX + (long)in_stack_00000008 * 8);
  uVar1 = *(uint *)(in_R8 + (long)in_stack_00000008 * 4);
  sVar5 = strlen((char *)local_40);
  local_58 = (int)sVar5;
  local_8c = uVar1 & 0x40;
  bVar8 = false;
  bVar3 = false;
  bVar2 = false;
  if (((uVar1 & 0x44) == 0) || ((uVar1 & 2) == 0)) {
    if ((uVar1 & 4) == 0) {
      if ((uVar1 & 0x80) == 0) {
        local_9c = 4;
        if ((in_stack_00000008 + 1 == in_stack_00000010) ||
           (in_stack_00000008 == in_stack_00000018 + -1)) {
          bVar2 = true;
        }
      }
      else {
        local_9c = 0x31;
      }
    }
    else {
      local_9c = 3;
    }
  }
  else if ((in_stack_00000008 + 1 == in_stack_00000010) ||
          (in_stack_00000008 == in_stack_00000018 + -1)) {
    local_9c = 7;
    if ((uVar1 & 4) != 0) {
      local_9c = 3;
    }
    bVar8 = (uVar1 & 2) != 0;
  }
  else {
    if ((((in_stack_00000008 + 2 == in_stack_00000010) ||
         (in_stack_00000008 == in_stack_00000018 + -2)) &&
        (**(byte **)(in_RCX + (long)(in_stack_00000008 + 1) * 8) < 0x80)) &&
       (ppuVar6 = __ctype_b_loc(),
       ((*ppuVar6)[(int)(uint)**(byte **)(in_RCX + (long)(in_stack_00000008 + 1) * 8)] & 0x800) != 0
       )) {
      bVar3 = true;
    }
    local_9c = 4;
  }
  if ((in_RDI->voccxflg & 4) != 0) {
    if (local_9c == 4) {
      local_148 = "adjective";
    }
    else {
      if (local_9c == 3) {
        local_150 = "noun";
      }
      else {
        local_150 = "plural";
        if (local_9c == 0) {
          local_150 = "unknown";
        }
      }
      local_148 = local_150;
    }
    pcVar7 = "";
    if (local_9c == 3 && local_8c != 0) {
      pcVar7 = " + plural";
    }
    sprintf(local_128,"... %s (treating as %s%s)\\n",local_40,local_148,pcVar7);
    outformat(local_148);
  }
  if (local_9c == 0x31) {
    *in_RSI = 0xffff;
    local_4 = 0;
  }
  else {
    local_54 = 0;
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            local_50 = vocffw(in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18,
                              in_stack_ffffffffffffff14,in_stack_ffffffffffffff08,
                              in_stack_ffffffffffffff04,in_stack_ffffffffffffff00,
                              in_stack_ffffffffffffff30);
            while (local_50 != (vocwdef *)0x0) {
              in_RSI[local_54] = local_50->vocwobj;
              *(undefined4 *)(in_RDX + (long)local_54 * 4) = 0;
              if (local_9c == 7) {
                *(uint *)(in_RDX + (long)local_54 * 4) =
                     *(uint *)(in_RDX + (long)local_54 * 4) | 0x40;
              }
              if ((local_9c == 4) && (bVar2)) {
                *(uint *)(in_RDX + (long)local_54 * 4) =
                     *(uint *)(in_RDX + (long)local_54 * 4) | 0x1000;
              }
              if (local_58 < (int)(uint)*(byte *)(local_88 + 8)) {
                *(uint *)(in_RDX + (long)local_54 * 4) =
                     *(uint *)(in_RDX + (long)local_54 * 4) | 0x2000;
              }
              local_12c = 0;
              while ((iVar4 = local_54 + 1, local_12c < local_54 &&
                     ((in_RSI[local_12c] != in_RSI[local_54] ||
                      (iVar4 = local_54,
                      *(int *)(in_RDX + (long)local_12c * 4) !=
                      *(int *)(in_RDX + (long)local_54 * 4)))))) {
                local_12c = local_12c + 1;
              }
              local_54 = iVar4;
              if (199 < local_54) {
                vocerr(in_RDI,3,"The word \"%s\" refers to too many objects.",local_40);
                *in_RSI = 0xffff;
                return -1;
              }
              local_50 = vocfnw(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
            }
            if ((!bVar3) || (local_9c != 4)) break;
            local_9c = 3;
            bVar3 = false;
          }
          if ((local_8c == 0) || (local_9c == 7)) break;
          local_9c = 7;
          local_8c = 0;
        }
        if ((!bVar8) || (local_9c == 4)) break;
        local_9c = 4;
        bVar2 = true;
        bVar8 = false;
      }
      if ((0x7f < *local_40) ||
         (((ppuVar6 = __ctype_b_loc(), ((*ppuVar6)[(int)(uint)*local_40] & 0x800) == 0 ||
           (local_9c != 4)) || (in_R9D + 1 == in_stack_00000010)))) break;
      local_40 = (byte *)0x3d7835;
      local_58 = 1;
    }
    in_RSI[local_54] = 0xffff;
    local_4 = local_54;
  }
  return local_4;
}

Assistant:

static int vocgol(voccxdef *ctx, objnum *list, uint *flags, char **wrdlst,
                  int *typlst, int first, int cur, int last, int ofword)
{
    char      *wrd;
    int        typ;
    vocwdef   *v;
    int        cnt;
    int        len;
    vocseadef  search_ctx;
    int        try_plural;
    int        try_noun_before_num;
    int        try_endadj;
    int        trying_endadj;
    int        wrdtyp;

    /* get the current word and its type */
    wrd = wrdlst[cur];
    typ = typlst[cur];

    /* get the length of the word */
    len = strlen(wrd);

    /*
     *   Get word type: figure out the correct part of speech, given by
     *   context, for a given word.  If it could count as only a
     *   noun/plural or only an adjective, we use that.  If it could count
     *   as either a noun/plural or an adjective, we will treat it as a
     *   noun/plural if it is the last word in the name or the last word
     *   before "of", otherwise as an adjective.
     *   
     *   If the word is unknown, treat it as a noun or adjective - treat
     *   it as part of the current noun phrase.  One unknown word renders
     *   the whole noun phrase unknown.  
     */
    try_plural = (typ & VOCT_PLURAL);

    /* presume we won't retry this word as an adjective */
    try_endadj = FALSE;

    /* presume we won't retry this as a noun before a number */
    try_noun_before_num = FALSE;

    /* we're not yet trying with adjective-at-end */
    trying_endadj = FALSE;

    /* check to see what parts of speech are defined for this word */
    if ((typ & (VOCT_NOUN | VOCT_PLURAL)) && (typ & VOCT_ADJ))
    {
        /*
         *   This can be either an adjective or a plural/noun.  If this is
         *   the last word in the noun phrase, treat it as a noun/plural if
         *   possible.  Otherwise, treat it as an adjective.  
         */
        if (cur + 1 == last || cur == ofword - 1)
        {
            /* 
             *   This is the last word in the entire phrase, or the last word
             *   before an 'of' (which makes it the last word of its
             *   subphrase).  Treat it as a noun if possible, otherwise as a
             *   plural 
             */
            wrdtyp = ((typ & VOCT_NOUN) ? PRP_NOUN : PRP_PLURAL);

            /* 
             *   If this can be an adjective, too, make a note to come back
             *   and try it again as an adjective.  We prefer not to end a
             *   noun phrase with an adjective, but we allow it, since it's
             *   often convenient to abbreviate a noun phrase to just the
             *   adjectives (as in TAKE RED, where there's only one object
             *   nearby to which RED applies).  
             */
            if ((typ & VOCT_ADJ) != 0)
                try_endadj = TRUE;
        }
        else if ((cur + 2 == last || cur == ofword - 2)
                 && vocisdigit(wrdlst[cur+1][0]))
        {
            /*
             *   This is the second-to-last word, and the last word is
             *   numeric.  In this case, try this word as BOTH a noun and an
             *   adjective.  Try it as an adjective first, but make a note to
             *   go back and try it again as a noun. 
             */
            wrdtyp = PRP_ADJ;
            try_noun_before_num = TRUE;
        }
        else
        {
            /* 
             *   This isn't the last word, so it can only be an adjective.
             *   Look at it only as an adjective.  
             */
            wrdtyp = PRP_ADJ;
        }
    }
    else if (typ & VOCT_NOUN)
        wrdtyp = PRP_NOUN;
    else if (typ & VOCT_UNKNOWN)
        wrdtyp = PRP_UNKNOWN;
    else
    {
        /* it's just an adjective */
        wrdtyp = PRP_ADJ;

        /* 
         *   if this is the last word in the phrase, flag it as an ending
         *   adjective 
         */
        if (cur + 1 == last || cur == ofword - 1)
            trying_endadj = TRUE;
    }

    /* display debugger information if appropriate */
    if (ctx->voccxflg & VOCCXFDBG)
    {
        char buf[128];

        sprintf(buf, "... %s (treating as %s%s)\\n", wrd,
                (wrdtyp == PRP_ADJ ? "adjective" :
                 wrdtyp == PRP_NOUN ? "noun" :
                 wrdtyp == PRP_INVALID ? "unknown" : "plural"),
                (wrdtyp == PRP_NOUN && try_plural ? " + plural" : ""));
        tioputs(ctx->vocxtio, buf);
    }

    /* if this is an unknown word, it doesn't have any objects */
    if (wrdtyp == PRP_UNKNOWN)
    {
        list[0] = MCMONINV;
        return 0;
    }

    /* we have nothing in the list yet */
    cnt = 0;

add_words:
    for (v = vocffw(ctx, wrd, len, (char *)0, 0, wrdtyp, &search_ctx)
         ; v != 0 ; v = vocfnw(ctx, &search_ctx))
    {
        int i;

        /* add the matching object to the output list */
        list[cnt] = v->vocwobj;

        /* clear the flags */
        flags[cnt] = 0;

        /* set the PLURAL flag if this is the plural vocabulary usage */
        if (wrdtyp == PRP_PLURAL)
            flags[cnt] |= VOCS_PLURAL;

        /* set the ADJECTIVE AT END flag if appropriate */
        if (wrdtyp == PRP_ADJ && trying_endadj)
            flags[cnt] |= VOCS_ENDADJ;

        /* 
         *   if this is not an exact match for the word, but is merely a
         *   long-enough leading substring, flag it as truncated 
         */
        if (len < search_ctx.v->voclen)
            flags[cnt] |= VOCS_TRUNC;

        /* count the additional word in the list */
        ++cnt;

        /* 
         *   if this object is already in the list with the same flags,
         *   don't add it again 
         */
        for (i = 0 ; i < cnt - 1 ; ++i)
        {
            /* check for an identical entry */
            if (list[i] == list[cnt-1] && flags[i] == flags[cnt-1])
            {
                /* take it back out of the list */
                --cnt;

                /* no need to continue looking for the duplicate */
                break;
            }
        }

        /* make sure we haven't overflowed the list */
        if (cnt >= VOCMAXAMBIG)
        {
            vocerr(ctx, VOCERR(3),
                   "The word \"%s\" refers to too many objects.", wrd);
            list[0] = MCMONINV;
            return -1;
        }
    }

    /*
     *   if we want to go back and try the word again as a noun before a
     *   number (as in "button 5"), do so now 
     */
    if (try_noun_before_num && wrdtyp == PRP_ADJ)
    {
        /* change the word type to noun */
        wrdtyp = PRP_NOUN;

        /* don't try this again */
        try_noun_before_num = FALSE;

        /* add the words for the noun usage */
        goto add_words;
    }

    /*
     *   if we're interpreting the word as a noun, and the word can be a
     *   plural, add in the plural interpretation as well 
     */
    if (try_plural && wrdtyp != PRP_PLURAL)
    {
        /* change the word type to plural */
        wrdtyp = PRP_PLURAL;

        /* don't try plurals again */
        try_plural = FALSE;

        /* add the words for the plural usage */
        goto add_words;
    }

    /* 
     *   if this was the last word in the phrase, and it could have been
     *   an adjective, try it again as an adjective 
     */
    if (try_endadj && wrdtyp != PRP_ADJ)
    {
        /* change the word type to adjective */
        wrdtyp = PRP_ADJ;

        /* note that we're retrying as an adjective */
        trying_endadj = TRUE;

        /* don't try this again */
        try_endadj = FALSE;

        /* add the words for the adjective usage */
        goto add_words;
    }

    /*
     *   If we're interpreting the word as an adjective, and it's
     *   numeric, include objects with "#" in their adjective list --
     *   these objects allow arbitrary numbers as adjectives.  Don't do
     *   this if there's only the one word.  
     */
    if (vocisdigit(wrd[0]) && wrdtyp == PRP_ADJ && first + 1 != last)
    {
        wrd = "#";
        len = 1;
        goto add_words;
    }

    list[cnt] = MCMONINV;
    return cnt;
}